

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_constant.h
# Opt level: O0

void count_label(shared_data *sd,float l)

{
  float l_local;
  shared_data *sd_local;
  
  if (((sd->is_more_than_two_labels_observed & 1U) == 0) && ((l != 3.4028235e+38 || (NAN(l))))) {
    if ((sd->first_observed_label != 3.4028235e+38) || (NAN(sd->first_observed_label))) {
      if ((sd->first_observed_label != l) || (NAN(sd->first_observed_label) || NAN(l))) {
        if ((sd->second_observed_label != 3.4028235e+38) || (NAN(sd->second_observed_label))) {
          if ((sd->second_observed_label != l) || (NAN(sd->second_observed_label) || NAN(l))) {
            sd->is_more_than_two_labels_observed = true;
          }
        }
        else {
          sd->second_observed_label = l;
        }
      }
    }
    else {
      sd->first_observed_label = l;
    }
  }
  return;
}

Assistant:

inline void count_label(shared_data* sd, float l)
{
  if (sd->is_more_than_two_labels_observed || l == FLT_MAX)
    return;

  if (sd->first_observed_label != FLT_MAX)
  {
    if (sd->first_observed_label != l)
    {
      if (sd->second_observed_label != FLT_MAX)
      {
        if (sd->second_observed_label != l)
          sd->is_more_than_two_labels_observed = true;
      }
      else
        sd->second_observed_label = l;
    }
  }
  else
    sd->first_observed_label = l;
}